

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformAccessLogger::assign3f
          (UniformAccessLogger *this,string *name,float x,float y,float z)

{
  MessageBuilder *pMVar1;
  Vector<float,_3> local_1c0 [2];
  MessageBuilder local_1a8;
  int local_28;
  float local_24;
  int loc;
  float z_local;
  float y_local;
  float x_local;
  string *name_local;
  UniformAccessLogger *this_local;
  
  local_24 = z;
  loc = (int)y;
  z_local = x;
  _y_local = name;
  name_local = (string *)this;
  local_28 = getLocation(this,name);
  tcu::TestLog::operator<<(&local_1a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [25])"// Assigning to uniform ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,_y_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a0a8b4);
  tcu::Vector<float,_3>::Vector(local_1c0,z_local,(float)loc,local_24);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  (*this->m_gl->uniform3f)(local_28,z_local,(GLfloat)loc,local_24);
  return;
}

Assistant:

void UniformAccessLogger::assign3f (const string& name, float x, float y, float z)
{
	const int loc = getLocation(name);
	m_log << TestLog::Message << "// Assigning to uniform " << name << ": " << Vec3(x, y, z) << TestLog::EndMessage;
	m_gl.uniform3f(loc, x, y, z);
}